

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::EmbeddingNDLayerParams::SharedDtor(EmbeddingNDLayerParams *this)

{
  ulong uVar1;
  WeightParams *pWVar2;
  undefined8 *puVar3;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if (puVar3 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x631e);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  if (this != (EmbeddingNDLayerParams *)_EmbeddingNDLayerParams_default_instance_) {
    pWVar2 = this->weights_;
    if (pWVar2 != (WeightParams *)0x0) {
      WeightParams::~WeightParams(pWVar2);
    }
    operator_delete(pWVar2,0x48);
    pWVar2 = this->bias_;
    if (pWVar2 != (WeightParams *)0x0) {
      WeightParams::~WeightParams(pWVar2);
    }
    operator_delete(pWVar2,0x48);
  }
  return;
}

Assistant:

inline void EmbeddingNDLayerParams::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete weights_;
  if (this != internal_default_instance()) delete bias_;
}